

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathCompOpEvalPredicate
               (xmlXPathParserContextPtr ctxt,xmlXPathStepOpPtr op,xmlNodeSetPtr set,int minPos,
               int maxPos,int hasNsNodes)

{
  int *piVar1;
  xmlXPathStepOp *pxVar2;
  xmlGenericErrorFunc p_Var3;
  long lVar4;
  xmlGenericErrorFunc *pp_Var5;
  void **ppvVar6;
  int iVar7;
  
  lVar4 = (long)op->ch1;
  if (lVar4 == -1) {
LAB_001e2a73:
    if (op->ch2 == -1) {
      return;
    }
    xmlXPathNodeSetFilter(ctxt,set,op->ch2,minPos,maxPos,hasNsNodes);
    return;
  }
  pxVar2 = ctxt->comp->steps;
  if (pxVar2[lVar4].op == XPATH_OP_PREDICATE) {
    iVar7 = ctxt->context->depth;
    if (iVar7 < 5000) {
      ctxt->context->depth = iVar7 + 1;
      xmlXPathCompOpEvalPredicate(ctxt,pxVar2 + lVar4,set,1,set->nodeNr,hasNsNodes);
      piVar1 = &ctxt->context->depth;
      *piVar1 = *piVar1 + -1;
      if (ctxt->error != 0) {
        return;
      }
      goto LAB_001e2a73;
    }
    iVar7 = 0x1a;
  }
  else {
    pp_Var5 = __xmlGenericError();
    p_Var3 = *pp_Var5;
    ppvVar6 = __xmlGenericErrorContext();
    (*p_Var3)(*ppvVar6,"xmlXPathCompOpEvalPredicate: Expected a predicate\n");
    iVar7 = 10;
  }
  xmlXPathErr(ctxt,iVar7);
  return;
}

Assistant:

static void
xmlXPathCompOpEvalPredicate(xmlXPathParserContextPtr ctxt,
			    xmlXPathStepOpPtr op,
			    xmlNodeSetPtr set,
                            int minPos, int maxPos,
			    int hasNsNodes)
{
    if (op->ch1 != -1) {
	xmlXPathCompExprPtr comp = ctxt->comp;
	/*
	* Process inner predicates first.
	*/
	if (comp->steps[op->ch1].op != XPATH_OP_PREDICATE) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompOpEvalPredicate: Expected a predicate\n");
            XP_ERROR(XPATH_INVALID_OPERAND);
	}
        if (ctxt->context->depth >= XPATH_MAX_RECURSION_DEPTH)
            XP_ERROR(XPATH_RECURSION_LIMIT_EXCEEDED);
        ctxt->context->depth += 1;
	xmlXPathCompOpEvalPredicate(ctxt, &comp->steps[op->ch1], set,
                                    1, set->nodeNr, hasNsNodes);
        ctxt->context->depth -= 1;
	CHECK_ERROR;
    }

    if (op->ch2 != -1)
        xmlXPathNodeSetFilter(ctxt, set, op->ch2, minPos, maxPos, hasNsNodes);
}